

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConvexHull.cpp
# Opt level: O2

void __thiscall
chrono::utils::ChConvexHull2D::ComputeGraham
          (ChConvexHull2D *this,
          vector<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_> *points,
          size_t n)

{
  pointer pCVar1;
  __normal_iterator<chrono::ChVector2<double>_*,_std::vector<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>_>
  __last;
  double dVar2;
  double dVar3;
  double dVar4;
  ulong uVar5;
  double *pdVar6;
  ulong uVar7;
  ulong uVar8;
  pointer pCVar9;
  PolarOrder local_18;
  
  pCVar1 = (points->
           super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       (points->
       super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  pdVar6 = pCVar1[1].m_data + 1;
  uVar8 = 0;
  for (uVar7 = 1; pCVar9 = pCVar1 + uVar8,
      uVar7 < (ulong)((long)__last._M_current - (long)pCVar1 >> 4); uVar7 = uVar7 + 1) {
    dVar2 = *pdVar6 - pCVar9->m_data[1];
    uVar5 = uVar7;
    if ((((0.0 <= dVar2) && (uVar5 = uVar8, dVar2 == 0.0)) && (!NAN(dVar2))) &&
       (((ChVector2<double> *)(pdVar6 + -1))->m_data[0] < pCVar9->m_data[0])) {
      uVar5 = uVar7;
    }
    uVar8 = uVar5;
    pdVar6 = pdVar6 + 2;
  }
  dVar2 = pCVar1->m_data[0];
  dVar3 = pCVar1->m_data[1];
  if (uVar8 != 0) {
    dVar4 = pCVar9->m_data[1];
    pCVar1->m_data[0] = pCVar9->m_data[0];
    pCVar1->m_data[1] = dVar4;
  }
  pCVar9->m_data[0] = dVar2;
  pCVar9->m_data[1] = dVar3;
  local_18.m_pivot.m_data[0] = pCVar1->m_data[0];
  local_18.m_pivot.m_data[1] = pCVar1->m_data[1];
  std::
  sort<__gnu_cxx::__normal_iterator<chrono::ChVector2<double>*,std::vector<chrono::ChVector2<double>,std::allocator<chrono::ChVector2<double>>>>,chrono::utils::PolarOrder>
            (pCVar1 + 1,__last,&local_18);
  return;
}

Assistant:

void ChConvexHull2D::ComputeGraham(std::vector<ChVector2<>>& points, size_t n) {
    // Find point with lowest y. Ties are broken for lowest x.
    size_t first = 0;
    for (size_t i = 1; i < points.size(); i++) {
        double dy = points[i].y() - points[first].y();
        if (dy < 0)
            first = i;
        else if (dy == 0 && points[i].x() < points[first].x())
            first = i;
    }

    // Swap this point in first position
    ChVector2<> tmp = points[0];
    points[0] = points[first];
    points[first] = tmp;

    // Sort the remaining points by polar order about the pivot.
    size_t pivot = 0;
    std::sort(std::next(points.begin()), points.end(), PolarOrder(points[pivot]));

    // Graham scan

    //// TODO
}